

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

void __thiscall
TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_>::TPZDohrPrecondV2SubData
          (TPZDohrPrecondV2SubData<float,_TPZDohrSubstructCondense<float>_> *this,int subindex,
          TPZAutoPointer<TPZDohrSubstructCondense<float>_> *substruct,
          TPZAutoPointer<TPZFMatrix<float>_> *res_local)

{
  TPZDohrAssembleItem<float> *this_00;
  TPZFMatrix<float> *this_01;
  TPZAutoPointer<TPZDohrAssembleItem<float>_> *in_RCX;
  int in_ESI;
  TPZDohrAssembleItem<float> *in_RDI;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TPZAutoPointer<TPZDohrSubstructCondense<float>_> *in_stack_ffffffffffffffa0;
  TPZDohrAssembleItem<float> *rval;
  
  rval = in_RDI;
  TPZAutoPointer<TPZDohrSubstructCondense<float>_>::TPZAutoPointer
            (in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZDohrSubstructCondense<float>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZFMatrix<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZFMatrix<float>_> *)in_stack_ffffffffffffffa0,
             (TPZAutoPointer<TPZFMatrix<float>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  TPZAutoPointer<TPZDohrAssembleItem<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembleItem<float>_> *)in_RDI);
  this_00 = (TPZDohrAssembleItem<float> *)operator_new(0x98);
  this_01 = TPZAutoPointer<TPZFMatrix<float>_>::operator->
                      ((TPZAutoPointer<TPZFMatrix<float>_> *)in_RCX);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)this_01);
  TPZDohrAssembleItem<float>::TPZDohrAssembleItem(this_00,in_ESI,in_stack_ffffffffffffff98);
  TPZAutoPointer<TPZDohrAssembleItem<float>_>::operator=(in_RCX,rval);
  return;
}

Assistant:

TPZDohrPrecondV2SubData(int subindex, const TPZAutoPointer<TSubStruct> &substruct, TPZAutoPointer<TPZFMatrix<TVar> > res_local) : fSubStructure(substruct),
	fInput_local(res_local)
	{
		fv2_local = new TPZDohrAssembleItem<TVar>(subindex, res_local->Rows());
	}